

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedNegative.cpp
# Opt level: O1

bool __thiscall
glcts::DrawBuffersIndexedNegative::ExpectedError
          (DrawBuffersIndexedNegative *this,GLenum expectedResult,char *call)

{
  int iVar1;
  GLenum GVar2;
  undefined4 extraout_var;
  size_t sVar3;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  iVar1 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar2 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  if (GVar2 != expectedResult) {
    local_1a0 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Error on ",9);
    if (call == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
    }
    else {
      sVar3 = strlen(call);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,call,sVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," call.\n",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"Expected ",9);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," but found ",0xb);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_198);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
    std::ios_base::~ios_base(local_128);
  }
  return GVar2 == expectedResult;
}

Assistant:

bool DrawBuffersIndexedNegative::ExpectedError(glw::GLenum expectedResult, const char* call)
{
	glw::GLenum error = m_context.getRenderContext().getFunctions().getError();

	if (expectedResult != error)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error on " << call << " call.\n"
						   << "Expected " << expectedResult << " but found " << error << tcu::TestLog::EndMessage;
		return false;
	}
	return true;
}